

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

DASHEventMessageBoxv1 *
event_track::generate_random_event
          (DASHEventMessageBoxv1 *__return_storage_ptr__,bool set_duration_to_zero,uint32_t max_p,
          uint32_t max_d)

{
  uint uVar1;
  uint32_t uVar2;
  result_type rVar3;
  uniform_int_distribution<unsigned_long> distD;
  uniform_int_distribution<unsigned_long> distP;
  mt19937 rng;
  random_device dev;
  
  std::random_device::random_device(&dev);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rng,(ulong)uVar1);
  distP._M_param._M_b = (unsigned_long)max_p;
  distP._M_param._M_a = 1;
  distD._M_param._M_b = (unsigned_long)max_d;
  distD._M_param._M_a = 1;
  DASHEventMessageBoxv1::DASHEventMessageBoxv1(__return_storage_ptr__);
  uVar2 = 0;
  if (!set_duration_to_zero) {
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&distD,&rng);
    uVar2 = (uint32_t)rVar3;
  }
  __return_storage_ptr__->event_duration_ = uVar2;
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&distP,&rng);
  __return_storage_ptr__->presentation_time_ = rVar3;
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->scheme_id_uri_);
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->value_);
  *(undefined4 *)&(__return_storage_ptr__->super_full_box).field_0x6c = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&__return_storage_ptr__->message_data_,2);
  *(__return_storage_ptr__->message_data_).
   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
   ._M_start = (uchar)__return_storage_ptr__->presentation_time_;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = (uchar)__return_storage_ptr__->event_duration_;
  std::random_device::~random_device(&dev);
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 event_track::generate_random_event(bool set_duration_to_zero, uint32_t max_p , uint32_t max_d )
{
	std::default_random_engine generator;
	std::random_device dev;
	std::mt19937 rng(dev());

	std::uniform_int_distribution<std::mt19937::result_type> distP(1, max_p);
	std::uniform_int_distribution<std::mt19937::result_type> distD(1, max_d);

	event_track::DASHEventMessageBoxv1 e;

	if (!set_duration_to_zero)
		e.event_duration_ = distD(rng);
	else
		e.event_duration_ = 0;

	e.presentation_time_ = distP(rng);
	e.scheme_id_uri_ = "random-1-100";
	e.value_ = "";
	e.timescale_ = 1;
	e.message_data_.resize(2);
	e.message_data_[0] = (uint8_t)e.presentation_time_;
	e.message_data_[1] = (uint8_t)e.event_duration_;

	return e;
}